

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_get_next_memhandle(Integer *ithandle,Integer *memhandle)

{
  ma_stats.calls[7] = ma_stats.calls[7] + 1;
  builtin_strncpy(ma_ebuf,"not yet implemented",0x14);
  ma_error(EL_Nonfatal,ET_External,"MA_get_next_memhandle",ma_ebuf);
  return 0;
}

Assistant:

public Boolean MA_get_next_memhandle(
    Integer    *ithandle,    /* handle for this iterator */
    Integer    *memhandle     /* RETURN: handle for the next block */)
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_next_memhandle]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* not yet implemented */
    (void)sprintf(ma_ebuf,
        "not yet implemented");
    ma_error(EL_Nonfatal, ET_External, "MA_get_next_memhandle", ma_ebuf);
    return MA_FALSE;
}